

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3140:43)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3140:43)>
          *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ColourMode CVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  long *plVar6;
  ulong *puVar7;
  StringRef colourMode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  Optional<Catch::ColourMode> maybeMode;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  undefined **local_70;
  undefined8 local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  ColourMode *local_40 [2];
  
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_assign((string *)&local_90);
  local_68 = 0;
  local_70 = &PTR__BasicResult_001b2540;
  local_58 = 0;
  local_50 = 0;
  local_60 = &local_50;
  toLower(&local_d0,&local_90);
  _Var5._M_p = local_d0._M_dataplus._M_p;
  paVar2 = &local_d0.field_2;
  colourMode.m_size = (size_type)local_d0._M_dataplus._M_p;
  colourMode.m_start = (char *)local_40;
  Catch::Detail::stringToColourMode(colourMode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar2) {
    operator_delete(_Var5._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_40[0] == (ColourMode *)0x0) {
    std::operator+(&local_b0,"colour mode must be one of: default, ansi, win32, or none. \'",
                   &local_90);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  }
  else {
    CVar3 = *local_40[0];
    if ((CVar3 < 4) && (CVar3 != Win32)) {
      ((this->m_lambda).config)->defaultColourMode = CVar3;
      *(undefined8 *)
       &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
        super_ResultBase.m_type = 0;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
      (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
      goto LAB_001622a2;
    }
    std::operator+(&local_b0,"colour mode \'",&local_90);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  }
  puVar7 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_d0.field_2._M_allocated_capacity = *puVar7;
    local_d0.field_2._8_8_ = plVar6[3];
    local_d0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *puVar7;
    local_d0._M_dataplus._M_p = (pointer)*plVar6;
  }
  sVar4 = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
  m_type = RuntimeError;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
  paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
         local_d0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_d0._M_dataplus._M_p;
    (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
         local_d0.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->m_errorMessage)._M_string_length = sVar4;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_allocated_capacity =
       local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
LAB_001622a2:
  local_70 = &PTR__BasicResult_001b2540;
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }